

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O1

int checkerBig(void)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  FILE *__stream;
  char *__s;
  bool bVar3;
  int d_1;
  int d;
  undefined8 local_38;
  
  local_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar2 = 0xffffffff;
  }
  else {
    iVar1 = 0;
    do {
      __s = ScanInt((FILE *)__stream,(int *)((long)&local_38 + 4));
      bVar3 = true;
      if (__s == "PASSED") {
        if (iVar1 == local_38._4_4_) {
          bVar3 = false;
          __s = "PASSED";
        }
        else {
          printf("wrong output -- ");
          __s = "FAILED";
        }
      }
    } while ((!bVar3) && (bVar3 = iVar1 != 4999, iVar1 = iVar1 + 1, bVar3));
    if (__s == "PASSED") {
      iVar1 = 5000;
      do {
        __s = ScanInt((FILE *)__stream,(int *)&local_38);
        bVar3 = true;
        if (__s == "PASSED") {
          if (iVar1 == (int)local_38) {
            bVar3 = false;
            __s = "PASSED";
          }
          else {
            printf("wrong output -- ");
            __s = "FAILED";
          }
        }
      } while ((!bVar3) && (bVar3 = iVar1 != 1, iVar1 = iVar1 + -1, bVar3));
    }
    if (__s == "PASSED") {
      iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
      if (iVar1 == 0) {
        __s = "PASSED";
      }
      else {
        __s = "FAILED";
      }
    }
    fclose(__stream);
    puts(__s);
    uVar2 = (uint)(__s == "FAILED");
  }
  testN = testN + 1;
  return uVar2;
}

Assistant:

static int checkerBig(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if (d != i) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        for (i = 0; i < 5000; i++) {
            int d;
            message = ScanInt(out, &d);
            if (message != Pass) {
                break;
            }
            if (d != 5000-i) {
                printf("wrong output -- ");
                message = Fail;
                break;
            }
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}